

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlHaltParser(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    while (1 < ctxt->inputNr) {
      input = inputPop(ctxt);
      xmlFreeInputStream(input);
    }
    if (ctxt->input != (xmlParserInputPtr)0x0) {
      if (ctxt->input->free != (xmlParserInputDeallocate)0x0) {
        (*ctxt->input->free)(ctxt->input->base);
        ctxt->input->free = (xmlParserInputDeallocate)0x0;
      }
      if (ctxt->input->buf != (xmlParserInputBufferPtr)0x0) {
        xmlFreeParserInputBuffer(ctxt->input->buf);
        ctxt->input->buf = (xmlParserInputBufferPtr)0x0;
      }
      ctxt->input->cur = "";
      ctxt->input->length = 0;
      ctxt->input->base = ctxt->input->cur;
      ctxt->input->end = ctxt->input->cur;
    }
  }
  return;
}

Assistant:

static void
xmlHaltParser(xmlParserCtxtPtr ctxt) {
    if (ctxt == NULL)
        return;
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    while (ctxt->inputNr > 1)
        xmlFreeInputStream(inputPop(ctxt));
    if (ctxt->input != NULL) {
        /*
	 * in case there was a specific allocation deallocate before
	 * overriding base
	 */
        if (ctxt->input->free != NULL) {
	    ctxt->input->free((xmlChar *) ctxt->input->base);
	    ctxt->input->free = NULL;
	}
        if (ctxt->input->buf != NULL) {
            xmlFreeParserInputBuffer(ctxt->input->buf);
            ctxt->input->buf = NULL;
        }
	ctxt->input->cur = BAD_CAST"";
        ctxt->input->length = 0;
	ctxt->input->base = ctxt->input->cur;
        ctxt->input->end = ctxt->input->cur;
    }
}